

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TempInputText
               (ImRect *bb,ImGuiID id,char *label,char *buf,int buf_size,ImGuiInputTextFlags flags)

{
  undefined1 auVar1 [16];
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  bool bVar4;
  ImVec2 IVar5;
  undefined8 extraout_XMM0_Qb;
  bool value_changed;
  bool init;
  ImGuiContext *g;
  ImGuiInputTextFlags in_stack_000005b4;
  ImVec2 *in_stack_000005b8;
  int in_stack_000005c4;
  char *in_stack_000005c8;
  char *in_stack_000005d0;
  char *in_stack_000005d8;
  ImGuiInputTextCallback in_stack_000005f0;
  void *in_stack_000005f8;
  ImRect *in_stack_ffffffffffffff98;
  
  pIVar2 = GImGui;
  bVar4 = GImGui->TempInputId != in_ESI;
  if (bVar4) {
    ClearActiveID();
  }
  (pIVar2->CurrentWindow->DC).CursorPos = *in_RDI;
  IVar5 = ImRect::GetSize(in_stack_ffffffffffffff98);
  auVar1._8_8_ = extraout_XMM0_Qb;
  auVar1._0_4_ = IVar5.x;
  auVar1._4_4_ = IVar5.y;
  vmovlpd_avx(auVar1);
  bVar3 = InputTextEx(in_stack_000005d8,in_stack_000005d0,in_stack_000005c8,in_stack_000005c4,
                      in_stack_000005b8,in_stack_000005b4,in_stack_000005f0,in_stack_000005f8);
  if (bVar4) {
    if (pIVar2->ActiveId != in_ESI) {
      __assert_fail("g.ActiveId == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0xcc0,
                    "bool ImGui::TempInputText(const ImRect &, ImGuiID, const char *, char *, int, ImGuiInputTextFlags)"
                   );
    }
    pIVar2->TempInputId = pIVar2->ActiveId;
  }
  return bVar3;
}

Assistant:

bool ImGui::TempInputText(const ImRect& bb, ImGuiID id, const char* label, char* buf, int buf_size, ImGuiInputTextFlags flags)
{
    // On the first frame, g.TempInputTextId == 0, then on subsequent frames it becomes == id.
    // We clear ActiveID on the first frame to allow the InputText() taking it back.
    ImGuiContext& g = *GImGui;
    const bool init = (g.TempInputId != id);
    if (init)
        ClearActiveID();

    g.CurrentWindow->DC.CursorPos = bb.Min;
    bool value_changed = InputTextEx(label, NULL, buf, buf_size, bb.GetSize(), flags);
    if (init)
    {
        // First frame we started displaying the InputText widget, we expect it to take the active id.
        IM_ASSERT(g.ActiveId == id);
        g.TempInputId = g.ActiveId;
    }
    return value_changed;
}